

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O3

void __thiscall
phmap::priv::anon_unknown_0::Btree_BtreeMultisetEmplace_Test::~Btree_BtreeMultisetEmplace_Test
          (Btree_BtreeMultisetEmplace_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Btree, BtreeMultisetEmplace) {
        const int value_to_insert = 123456;
        phmap::btree_multiset<int> s;
        auto iter = s.emplace(value_to_insert);
        ASSERT_NE(iter, s.end());
        EXPECT_EQ(*iter, value_to_insert);
        auto iter2 = s.emplace(value_to_insert);
        EXPECT_NE(iter2, iter);
        ASSERT_NE(iter2, s.end());
        EXPECT_EQ(*iter2, value_to_insert);
        auto result = s.equal_range(value_to_insert);
        EXPECT_EQ(std::distance(result.first, result.second), 2);
    }